

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t older(stat *st,archive_entry *entry)

{
  long lVar1;
  time_t tVar2;
  ulong uVar3;
  long lVar4;
  time_t local_70;
  time_t local_68;
  __time_t local_58;
  __time_t local_50;
  time_t local_48;
  time_t local_40;
  __time_t local_30;
  __time_t local_28;
  archive_entry *entry_local;
  stat *st_local;
  
  if ((st->st_mtim).tv_sec < 0) {
    local_28 = (st->st_mtim).tv_sec;
  }
  else {
    if ((ulong)(st->st_mtim).tv_sec < 0x8000000000000000) {
      local_30 = (st->st_mtim).tv_sec;
    }
    else {
      local_30 = 0x7fffffffffffffff;
    }
    local_28 = local_30;
  }
  tVar2 = archive_entry_mtime(entry);
  if (tVar2 < 0) {
    local_40 = archive_entry_mtime(entry);
  }
  else {
    uVar3 = archive_entry_mtime(entry);
    if (uVar3 < 0x8000000000000000) {
      local_48 = archive_entry_mtime(entry);
    }
    else {
      local_48 = 0x7fffffffffffffff;
    }
    local_40 = local_48;
  }
  if (local_28 < local_40) {
    st_local._4_4_ = L'\x01';
  }
  else {
    if ((st->st_mtim).tv_sec < 0) {
      local_50 = (st->st_mtim).tv_sec;
    }
    else {
      if ((ulong)(st->st_mtim).tv_sec < 0x8000000000000000) {
        local_58 = (st->st_mtim).tv_sec;
      }
      else {
        local_58 = 0x7fffffffffffffff;
      }
      local_50 = local_58;
    }
    tVar2 = archive_entry_mtime(entry);
    if (tVar2 < 0) {
      local_68 = archive_entry_mtime(entry);
    }
    else {
      uVar3 = archive_entry_mtime(entry);
      if (uVar3 < 0x8000000000000000) {
        local_70 = archive_entry_mtime(entry);
      }
      else {
        local_70 = 0x7fffffffffffffff;
      }
      local_68 = local_70;
    }
    if (local_68 < local_50) {
      st_local._4_4_ = L'\0';
    }
    else {
      lVar1 = (st->st_mtim).tv_nsec;
      lVar4 = archive_entry_mtime_nsec(entry);
      if (lVar1 < lVar4) {
        st_local._4_4_ = L'\x01';
      }
      else {
        st_local._4_4_ = L'\0';
      }
    }
  }
  return st_local._4_4_;
}

Assistant:

static int
older(struct stat *st, struct archive_entry *entry)
{
	/* First, test the seconds and return if we have a definite answer. */
	/* Definitely older. */
	if (to_int64_time(st->st_mtime) < to_int64_time(archive_entry_mtime(entry)))
		return (1);
	/* Definitely younger. */
	if (to_int64_time(st->st_mtime) > to_int64_time(archive_entry_mtime(entry)))
		return (0);
	/* If this platform supports fractional seconds, try those. */
#if HAVE_STRUCT_STAT_ST_MTIMESPEC_TV_NSEC
	/* Definitely older. */
	if (st->st_mtimespec.tv_nsec < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_MTIM_TV_NSEC
	/* Definitely older. */
	if (st->st_mtim.tv_nsec < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_MTIME_N
	/* older. */
	if (st->st_mtime_n < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_UMTIME
	/* older. */
	if (st->st_umtime * 1000 < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_MTIME_USEC
	/* older. */
	if (st->st_mtime_usec * 1000 < archive_entry_mtime_nsec(entry))
		return (1);
#else
	/* This system doesn't have high-res timestamps. */
#endif
	/* Same age or newer, so not older. */
	return (0);
}